

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O0

void mwWriteOF(void *p)

{
  uchar *ptr;
  int i;
  void *p_local;
  
  for (ptr._4_4_ = 0; ptr._4_4_ < mwOverflowZoneSize; ptr._4_4_ = ptr._4_4_ + 1) {
    *(uchar *)((long)p + (long)ptr._4_4_) = mwOverflowZoneTemplate[ptr._4_4_ % 8];
  }
  return;
}

Assistant:

static void mwWriteOF(void *p)
{
	int i;
	unsigned char *ptr;
	ptr = (unsigned char *) p;
	for (i = 0; i < mwOverflowZoneSize; i++) {
		*(ptr + i) = mwOverflowZoneTemplate[i % 8];
	}
	return;
}